

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Parser * __thiscall
Catch::clara::detail::Parser::operator|(Parser *__return_storage_ptr__,Parser *this,Help *other)

{
  Parser *pPVar1;
  Parser local_80;
  Help *local_20;
  Help *other_local;
  Parser *this_local;
  
  local_20 = other;
  other_local = (Help *)this;
  this_local = __return_storage_ptr__;
  Parser(&local_80,this);
  pPVar1 = operator|=(&local_80,&other->super_Opt);
  Parser(__return_storage_ptr__,pPVar1);
  ~Parser(&local_80);
  return __return_storage_ptr__;
}

Assistant:

auto operator|(T const &other) const -> Parser {
          return Parser(*this) |= other;
        }